

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O0

hugeint_t duckdb::Hugeint::Multiply<true>(hugeint_t lhs,hugeint_t rhs)

{
  hugeint_t hVar1;
  hugeint_t hVar2;
  ulong uVar3;
  undefined8 uVar4;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  int64_t in_RSI;
  OutOfRangeException *in_RDI;
  hugeint_t result;
  allocator local_71;
  string local_70 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  hugeint_t local_10;
  
  hVar2.upper = in_RSI;
  hVar2.lower = (uint64_t)in_RDI;
  hVar1.upper = (int64_t)in_RCX;
  hVar1.lower = (uint64_t)in_RDX;
  uVar3 = duckdb::Hugeint::TryMultiply(hVar2,hVar1,&local_10);
  if ((uVar3 & 1) == 0) {
    uVar4 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Overflow in HUGEINT multiplication: %s + %s",&local_71);
    duckdb::hugeint_t::ToString_abi_cxx11_();
    duckdb::hugeint_t::ToString_abi_cxx11_();
    OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
              (in_RDI,in_RCX,in_RDX,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar4,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  return local_10;
}

Assistant:

inline static hugeint_t Multiply(hugeint_t lhs, hugeint_t rhs) {
		hugeint_t result;
		if (!TryMultiply(lhs, rhs, result)) {
			throw OutOfRangeException("Overflow in HUGEINT multiplication: %s + %s", lhs.ToString(), rhs.ToString());
		}
		return result;
	}